

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void ARGBPolynomialRow_AVX2(uint8_t *src_argb,uint8_t *dst_argb,float *poly,int width)

{
  undefined1 auVar1 [16];
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  int iVar14;
  undefined1 auVar15 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar17 [64];
  undefined1 in_ZMM3 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar16 [32];
  
  auVar19._16_16_ = *(undefined1 (*) [16])poly;
  auVar19._0_16_ = *(undefined1 (*) [16])poly;
  auVar20._16_16_ = *(undefined1 (*) [16])(poly + 4);
  auVar20._0_16_ = *(undefined1 (*) [16])(poly + 4);
  auVar21._16_16_ = *(undefined1 (*) [16])(poly + 8);
  auVar21._0_16_ = *(undefined1 (*) [16])(poly + 8);
  fVar10 = poly[0xc];
  fVar11 = poly[0xd];
  fVar12 = poly[0xe];
  fVar13 = poly[0xf];
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)src_argb;
    auVar15 = vpmovzxbd_avx2(auVar1);
    src_argb = (uint8_t *)((long)src_argb + 8);
    auVar15 = vcvtdq2ps_avx(auVar15);
    fVar3 = auVar15._0_4_;
    auVar17._0_4_ = fVar3 * fVar3;
    fVar4 = auVar15._4_4_;
    auVar17._4_4_ = fVar4 * fVar4;
    fVar5 = auVar15._8_4_;
    auVar17._8_4_ = fVar5 * fVar5;
    fVar6 = auVar15._12_4_;
    auVar17._12_4_ = fVar6 * fVar6;
    fVar7 = auVar15._16_4_;
    auVar17._16_4_ = fVar7 * fVar7;
    fVar8 = auVar15._20_4_;
    auVar17._20_4_ = fVar8 * fVar8;
    fVar9 = auVar15._24_4_;
    auVar17._28_36_ = in_ZMM2._28_36_;
    auVar17._24_4_ = fVar9 * fVar9;
    auVar16 = auVar17._0_32_;
    in_ZMM2 = ZEXT3264(auVar16);
    auVar18._0_4_ = fVar3 * fVar10;
    auVar18._4_4_ = fVar4 * fVar11;
    auVar18._8_4_ = fVar5 * fVar12;
    auVar18._12_4_ = fVar6 * fVar13;
    auVar18._16_4_ = fVar7 * fVar10;
    auVar18._20_4_ = fVar8 * fVar11;
    auVar18._28_36_ = in_ZMM3._28_36_;
    auVar18._24_4_ = fVar9 * fVar12;
    in_ZMM3 = ZEXT3264(auVar18._0_32_);
    auVar1 = vfmadd132ps_fma(auVar15,auVar19,auVar20);
    auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar16,auVar21);
    auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar16,auVar18._0_32_);
    auVar15 = ZEXT1632(CONCAT412((int)auVar1._12_4_,
                                 CONCAT48((int)auVar1._8_4_,
                                          CONCAT44((int)auVar1._4_4_,(int)auVar1._0_4_))));
    auVar15 = vpackusdw_avx2(auVar15,auVar15);
    auVar15 = vpermq_avx2(auVar15,0xd8);
    auVar1 = vpackuswb_avx(auVar15._0_16_,auVar15._0_16_);
    *(long *)dst_argb = auVar1._0_8_;
    dst_argb = dst_argb + 8;
    iVar14 = width + -2;
    bVar2 = 1 < width;
    width = iVar14;
  } while (iVar14 != 0 && bVar2);
  return;
}

Assistant:

void ARGBPolynomialRow_AVX2(const uint8_t* src_argb,
                            uint8_t* dst_argb,
                            const float* poly,
                            int width) {
  asm volatile(
      "vbroadcastf128 (%3),%%ymm4                \n"
      "vbroadcastf128 0x10(%3),%%ymm5            \n"
      "vbroadcastf128 0x20(%3),%%ymm6            \n"
      "vbroadcastf128 0x30(%3),%%ymm7            \n"

      // 2 pixel loop.
      LABELALIGN
      "1:                                        \n"
      "vpmovzxbd   (%0),%%ymm0                   \n"  // 2 ARGB pixels
      "lea         0x8(%0),%0                    \n"
      "vcvtdq2ps   %%ymm0,%%ymm0                 \n"  // X 8 floats
      "vmulps      %%ymm0,%%ymm0,%%ymm2          \n"  // X * X
      "vmulps      %%ymm7,%%ymm0,%%ymm3          \n"  // C3 * X
      "vfmadd132ps %%ymm5,%%ymm4,%%ymm0          \n"  // result = C0 + C1 * X
      "vfmadd231ps %%ymm6,%%ymm2,%%ymm0          \n"  // result += C2 * X * X
      "vfmadd231ps %%ymm3,%%ymm2,%%ymm0          \n"  // result += C3 * X * X *
                                                      // X
      "vcvttps2dq  %%ymm0,%%ymm0                 \n"
      "vpackusdw   %%ymm0,%%ymm0,%%ymm0          \n"
      "vpermq      $0xd8,%%ymm0,%%ymm0           \n"
      "vpackuswb   %%xmm0,%%xmm0,%%xmm0          \n"
      "vmovq       %%xmm0,(%1)                   \n"
      "lea         0x8(%1),%1                    \n"
      "sub         $0x2,%2                       \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src_argb),  // %0
        "+r"(dst_argb),  // %1
        "+r"(width)      // %2
      : "r"(poly)        // %3
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6",
        "xmm7");
}